

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

QPDF_ERROR_CODE qpdf_add_page(qpdf_data qpdf,qpdf_data newpage_qpdf,qpdf_oh newpage,QPDF_BOOL first)

{
  QPDF_ERROR_CODE QVar1;
  QPDFObjectHandle page;
  undefined1 auStack_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  element_type *local_28;
  code *pcStack_20;
  
  qpdf_oh_item_internal((qpdf_data)auStack_48,(qpdf_oh)newpage_qpdf);
  _Stack_30._M_pi._4_4_ = 0;
  _Stack_30._M_pi._0_4_ = first;
  pcStack_20 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1872:30)>
               ::_M_invoke;
  local_28 = (element_type *)
             std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1872:30)>
             ::_M_manager;
  auStack_48._16_8_ = (element_type *)auStack_48;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)(auStack_48 + 0x10));
  if (local_28 != (element_type *)0x0) {
    (*(code *)local_28)(auStack_48 + 0x10,auStack_48 + 0x10,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_);
  }
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_add_page(qpdf_data qpdf, qpdf_data newpage_qpdf, qpdf_oh newpage, QPDF_BOOL first)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_add_page");
    auto page = qpdf_oh_item_internal(newpage_qpdf, newpage);
    return trap_errors(qpdf, [&page, first](qpdf_data q) { q->qpdf->addPage(page, first); });
}